

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

shared_ptr<helics::Core> helics::CoreFactory::findCore(string_view name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_RDI;
  shared_ptr<helics::Core> sVar1;
  allocator<char> local_41;
  string local_40 [32];
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_40,&local_20,&local_41);
  gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::findObject
            (in_RDI,(string *)searchableCores);
  std::__cxx11::string::~string(local_40);
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI
  ;
  return (shared_ptr<helics::Core>)
         sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> findCore(std::string_view name)
{
    return searchableCores.findObject(std::string{name});
}